

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
MCTS::compute_tree<GoState<3u,3u>>
          (GoState<3U,_3U> *root_state,ComputeOptions options,result_type initial_seed)

{
  runtime_error *this;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *this_00;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_RSI;
  tuple<MCTS::Node<GoState<3U,_3U>_>_*,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_> in_RDI;
  bool bVar1;
  Move move;
  pointer node;
  int iter;
  GoState<3U,_3U> state;
  mt19937_64 random_engine;
  unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
  *root;
  pointer in_stack_fffffffffffff538;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff540;
  GoState<3U,_3U> *in_stack_fffffffffffff548;
  undefined7 in_stack_fffffffffffff550;
  undefined1 in_stack_fffffffffffff557;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_fffffffffffff558;
  Move in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  bool local_a8b;
  Node<GoState<3U,_3U>_> *in_stack_fffffffffffff580;
  _Head_base<0UL,_MCTS::Node<GoState<3U,_3U>_>_*,_false> this_01;
  GoState<3U,_3U> *state_00;
  undefined4 in_stack_fffffffffffff5a8;
  Move MVar2;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmVar3;
  int move_00;
  GoState<3U,_3U> *in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff794;
  char *in_stack_fffffffffffff798;
  char *in_stack_fffffffffffff7a0;
  
  state_00 = (GoState<3U,_3U> *)&stack0x00000008;
  this_01._M_head_impl =
       (Node<GoState<3U,_3U>_> *)
       in_RDI.
       super__Tuple_impl<0UL,_MCTS::Node<GoState<3U,_3U>_>_*,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
       .super__Head_base<0UL,_MCTS::Node<GoState<3U,_3U>_>_*,_false>._M_head_impl;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine(in_stack_fffffffffffff540,(result_type)in_stack_fffffffffffff538);
  if ((*(int *)((long)&state_00->_vptr_GoState + 4) < 0) && (*(double *)state_00->board < 0.0)) {
    assertion_failed(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff794);
  }
  if (0.0 <= *(double *)state_00->board) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"ComputeOptions::max_time requires OpenMP.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(int *)((long)in_RSI->_M_x + 0x4c) != 1) && (*(int *)((long)in_RSI->_M_x + 0x4c) != 2)) {
    assertion_failed(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff794);
  }
  operator_new(0x60);
  Node<GoState<3U,_3U>_>::Node
            ((Node<GoState<3U,_3U>_> *)in_stack_fffffffffffff540,
             (GoState<3U,_3U> *)in_stack_fffffffffffff538);
  std::unique_ptr<MCTS::Node<GoState<3u,3u>>,std::default_delete<MCTS::Node<GoState<3u,3u>>>>::
  unique_ptr<std::default_delete<MCTS::Node<GoState<3u,3u>>>,void>
            ((unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
              *)in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  GoState<3U,_3U>::GoState((GoState<3U,_3U> *)this_01._M_head_impl);
  move_00 = 1;
  while( true ) {
    bVar1 = true;
    if (*(int *)((long)&state_00->_vptr_GoState + 4) < move_00) {
      bVar1 = *(int *)((long)&state_00->_vptr_GoState + 4) < 0;
    }
    if (!bVar1) break;
    this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
               *)std::
                 unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
                 ::get((unique_ptr<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
                        *)in_stack_fffffffffffff540);
    GoState<3U,_3U>::operator=
              ((GoState<3U,_3U> *)in_stack_fffffffffffff540,
               (GoState<3U,_3U> *)in_stack_fffffffffffff538);
    while( true ) {
      bVar1 = Node<GoState<3U,_3U>_>::has_untried_moves((Node<GoState<3U,_3U>_> *)0x1b71bd);
      local_a8b = false;
      if (!bVar1) {
        local_a8b = Node<GoState<3U,_3U>_>::has_children((Node<GoState<3U,_3U>_> *)0x1b71de);
      }
      if (local_a8b == false) break;
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)Node<GoState<3U,_3U>_>::select_child_UCT(in_stack_fffffffffffff580);
      GoState<3U,_3U>::do_move(in_stack_fffffffffffff5c0,move_00);
    }
    bVar1 = Node<GoState<3U,_3U>_>::has_untried_moves((Node<GoState<3U,_3U>_> *)0x1b729a);
    in_stack_fffffffffffff564 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff564);
    if (bVar1) {
      in_stack_fffffffffffff560 =
           Node<GoState<3u,3u>>::
           get_untried_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     ((Node<GoState<3U,_3U>_> *)
                      CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      in_stack_fffffffffffff558);
      MVar2 = in_stack_fffffffffffff560;
      GoState<3U,_3U>::do_move(in_stack_fffffffffffff5c0,move_00);
      in_stack_fffffffffffff558 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)Node<GoState<3U,_3U>_>::add_child
                        ((Node<GoState<3U,_3U>_> *)this_00,
                         (Move *)CONCAT44(MVar2,in_stack_fffffffffffff5a8),state_00);
      this_00 = in_stack_fffffffffffff558;
    }
    while (in_stack_fffffffffffff557 =
                GoState<3U,_3U>::has_moves
                          ((GoState<3U,_3U> *)
                           CONCAT17(in_stack_fffffffffffff557,in_stack_fffffffffffff550)),
          (bool)in_stack_fffffffffffff557) {
      GoState<3u,3u>::
      do_random_move<std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                ((GoState<3U,_3U> *)this_01._M_head_impl,in_RSI);
    }
    while (this_00 !=
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)0x0) {
      pmVar3 = this_00;
      in_stack_fffffffffffff548 =
           (GoState<3U,_3U> *)
           GoState<3U,_3U>::get_result(in_stack_fffffffffffff548,(int)((ulong)this_00 >> 0x20));
      Node<GoState<3U,_3U>_>::update
                ((Node<GoState<3U,_3U>_> *)this_00,(double)in_stack_fffffffffffff548);
      in_stack_fffffffffffff540 = this_00;
      this_00 = (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                 *)pmVar3->_M_x[1];
    }
    move_00 = move_00 + 1;
  }
  GoState<3U,_3U>::~GoState((GoState<3U,_3U> *)0x1b73b8);
  return (__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
          )(__uniq_ptr_data<MCTS::Node<GoState<3U,_3U>_>,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_MCTS::Node<GoState<3U,_3U>_>_*,_std::default_delete<MCTS::Node<GoState<3U,_3U>_>_>_>
             .super__Head_base<0UL,_MCTS::Node<GoState<3U,_3U>_>_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Node<State>>  compute_tree(const State root_state,
                                           const ComputeOptions options,
                                           std::mt19937_64::result_type initial_seed)
{
	std::mt19937_64 random_engine(initial_seed);

	attest(options.max_iterations >= 0 || options.max_time >= 0);
	if (options.max_time >= 0) {
		#ifndef USE_OPENMP
		throw std::runtime_error("ComputeOptions::max_time requires OpenMP.");
		#endif
	}
	// Will support more players later.
	attest(root_state.player_to_move == 1 || root_state.player_to_move == 2);
	auto root = std::unique_ptr<Node<State>>(new Node<State>(root_state));

	#ifdef USE_OPENMP
	double start_time = ::omp_get_wtime();
	double print_time = start_time;
	#endif

	State state;
	for (int iter = 1; iter <= options.max_iterations || options.max_iterations < 0; ++iter) {
		auto node = root.get();
		state = root_state;

		// Select a path through the tree to a leaf node.
		while (!node->has_untried_moves() && node->has_children()) {
			node = node->select_child_UCT();
			state.do_move(node->move);
		}

		// If we are not already at the final state, expand the
		// tree with a new node and move there.
		if (node->has_untried_moves()) {
			auto move = node->get_untried_move(&random_engine);
			state.do_move(move);
			node = node->add_child(move, state);
		}

		// We now play randomly until the game ends.
		while (state.has_moves()) {
			state.do_random_move(&random_engine);
		}

		// We have now reached a final state. Backpropagate the result
		// up the tree to the root node.
		while (node != nullptr) {
			node->update(state.get_result(node->player_to_move));
			node = node->parent;
		}

		#ifdef USE_OPENMP
		if (options.verbose || options.max_time >= 0) {
			double time = ::omp_get_wtime();
			if (options.verbose && (time - print_time >= 1.0 || iter == options.max_iterations)) {
				std::cerr << iter << " games played (" << double(iter) / (time - start_time) << " / second)." << endl;
				print_time = time;
			}

			if (time - start_time >= options.max_time) {
				break;
			}
		}
		#endif
	}

	return root;
}